

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomUpEvaluation.hpp
# Opt level: O0

TermList __thiscall
Lib::
BottomUpEvaluation<Kernel::AutoDerefTermSpec,_Kernel::TermList,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.cpp:509:15),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.cpp:520:15),_Kernel::OnlyMemorizeNonVar<Kernel::TermList>_&,_Kernel::AutoDerefTermSpec::Context>
::apply(BottomUpEvaluation<Kernel::AutoDerefTermSpec,_Kernel::TermList,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:509:15),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:520:15),_Kernel::OnlyMemorizeNonVar<Kernel::TermList>_&,_Kernel::AutoDerefTermSpec::Context>
        *this,AutoDerefTermSpec *toEval)

{
  Context c;
  anon_class_24_3_9e03d13b init;
  bool bVar1;
  uint uVar2;
  Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_> *pSVar3;
  TermList *pTVar4;
  Stack<Kernel::TermList> *pSVar5;
  Stack<Kernel::TermList> *in_RDI;
  TermList eval;
  TermList *argLst;
  BottomUpChildIter<Kernel::AutoDerefTermSpec> orig;
  Option<Kernel::TermList> cached;
  Option<Kernel::TermList> nonRec;
  AutoDerefTermSpec t;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> recResults;
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  recState;
  TermList result;
  Stack<Kernel::TermList> *in_stack_fffffffffffffda8;
  TermList in_stack_fffffffffffffdb0;
  BottomUpChildIter<Kernel::AutoDerefTermSpec> *in_stack_fffffffffffffdb8;
  Context in_stack_fffffffffffffdc0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffdc8;
  Stack<Kernel::TermList> *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  uint in_stack_fffffffffffffddc;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_fffffffffffffdf0;
  AutoDerefTermSpec *in_stack_fffffffffffffe10;
  Stack<Kernel::TermList> *in_stack_fffffffffffffe18;
  TermList *local_1d8;
  Stack<Kernel::TermList> *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  Stack<Kernel::TermList> *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  BottomUpChildIter<Kernel::AutoDerefTermSpec> *in_stack_fffffffffffffe80;
  undefined1 local_f8 [32];
  size_t local_d8;
  uint64_t local_b8;
  OptionBase<Kernel::TermList> local_b0;
  uint64_t local_a0;
  size_t local_88;
  size_t local_70;
  size_t local_68;
  uint64_t local_8;
  
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_fffffffffffffdb0._content);
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            ((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_stack_fffffffffffffdb0._content);
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x95b860);
  local_68 = in_RDI[1]._capacity;
  BottomUpChildIter<Kernel::AutoDerefTermSpec>::BottomUpChildIter
            (in_stack_fffffffffffffdb8,(Item *)in_stack_fffffffffffffdb0._content,
             in_stack_fffffffffffffdc0);
  Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>::push
            ((Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_> *)
             in_stack_fffffffffffffdc0.subs,in_stack_fffffffffffffdb8);
  while( true ) {
    pSVar3 = Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x95b8c3);
    bVar1 = Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>::isEmpty(pSVar3);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar3 = Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x95b902);
    Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>::top(pSVar3);
    local_70 = in_RDI[1]._capacity;
    bVar1 = BottomUpChildIter<Kernel::AutoDerefTermSpec>::hasNext
                      (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
    if (bVar1) {
      pSVar3 = Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                             *)0x95b972);
      in_stack_fffffffffffffe80 =
           Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>::top(pSVar3);
      local_88 = in_RDI[1]._capacity;
      c.subs._4_4_ = in_stack_fffffffffffffddc;
      c.subs._0_4_ = in_stack_fffffffffffffdd8;
      BottomUpChildIter<Kernel::AutoDerefTermSpec>::next
                ((BottomUpChildIter<Kernel::AutoDerefTermSpec> *)in_stack_fffffffffffffdd0,c);
      const::$_1::operator()
                (in_stack_fffffffffffffdc8,(AutoDerefTermSpec *)in_stack_fffffffffffffdc0.subs);
      in_stack_fffffffffffffe7f =
           Lib::Option::operator_cast_to_bool((Option<Kernel::TermList> *)0x95b9f6);
      if ((bool)in_stack_fffffffffffffe7f) {
        in_stack_fffffffffffffe70 =
             Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
             operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x95ba1c);
        pTVar4 = Option<Kernel::TermList>::operator*((Option<Kernel::TermList> *)0x95ba33);
        local_a0 = (uint64_t)move_if_value<Kernel::TermList,_true>(pTVar4);
        Stack<Kernel::TermList>::push(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
      }
      else {
        Kernel::OnlyMemorizeNonVar<Kernel::TermList>::get
                  ((OnlyMemorizeNonVar<Kernel::TermList> *)in_stack_fffffffffffffe18,
                   in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe5f = OptionBase<Kernel::TermList>::isSome(&local_b0);
        if ((bool)in_stack_fffffffffffffe5f) {
          in_stack_fffffffffffffe50 =
               Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
               operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x95bb21);
          pTVar4 = OptionBase<Kernel::TermList>::unwrap((OptionBase<Kernel::TermList> *)0x95bb38);
          local_b8 = pTVar4->_content;
          Stack<Kernel::TermList>::push(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
        }
        else {
          Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0x95bba4);
          local_d8 = in_RDI[1]._capacity;
          BottomUpChildIter<Kernel::AutoDerefTermSpec>::BottomUpChildIter
                    (in_stack_fffffffffffffdb8,(Item *)in_stack_fffffffffffffdb0._content,
                     in_stack_fffffffffffffdc0);
          Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>::push
                    ((Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_> *)
                     in_stack_fffffffffffffdc0.subs,in_stack_fffffffffffffdb8);
        }
        Option<Kernel::TermList>::~Option((Option<Kernel::TermList> *)0x95bc07);
      }
      Option<Kernel::TermList>::~Option((Option<Kernel::TermList> *)0x95bc14);
    }
    else {
      pSVar3 = Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                             *)0x95bc38);
      Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>::pop
                ((BottomUpChildIter<Kernel::AutoDerefTermSpec> *)(local_f8 + 8),pSVar3);
      uVar2 = BottomUpChildIter<Kernel::AutoDerefTermSpec>::nChildren
                        (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
      if (uVar2 == 0) {
        local_1d8 = (TermList *)0x0;
      }
      else {
        pSVar5 = Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 ::operator*((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                              *)0x95bcb3);
        in_stack_fffffffffffffe18 =
             Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
             operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x95bcc7);
        in_stack_fffffffffffffe10 =
             (AutoDerefTermSpec *)Stack<Kernel::TermList>::size(in_stack_fffffffffffffe18);
        uVar2 = BottomUpChildIter<Kernel::AutoDerefTermSpec>::nChildren
                          (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
        local_1d8 = Stack<Kernel::TermList>::operator[]
                              (pSVar5,(long)in_stack_fffffffffffffe10 - (ulong)uVar2);
      }
      local_f8._0_8_ = local_1d8;
      in_stack_fffffffffffffdf0 =
           (Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           in_RDI->_end;
      BottomUpChildIter<Kernel::AutoDerefTermSpec>::self
                ((BottomUpChildIter<Kernel::AutoDerefTermSpec> *)(local_f8 + 8));
      in_stack_fffffffffffffdb0._content = (uint64_t)(local_f8 + 8);
      in_stack_fffffffffffffdb8 = (BottomUpChildIter<Kernel::AutoDerefTermSpec> *)local_f8;
      init.orig._0_7_ = in_stack_fffffffffffffe78;
      init.this = (BottomUpEvaluation<Kernel::AutoDerefTermSpec,_Kernel::TermList,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:509:15),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:520:15),_Kernel::OnlyMemorizeNonVar<Kernel::TermList>_&,_Kernel::AutoDerefTermSpec::Context>
                   *)in_stack_fffffffffffffe70;
      init.orig._7_1_ = in_stack_fffffffffffffe7f;
      init.argLst = (TermList **)in_stack_fffffffffffffe80;
      in_stack_fffffffffffffda8 = in_RDI;
      Kernel::OnlyMemorizeNonVar<Kernel::TermList>::
      getOrInit<Lib::BottomUpEvaluation<Kernel::AutoDerefTermSpec,Kernel::TermList,Kernel::RobSubstitution::apply(Kernel::TermList,int)const::__0,Kernel::RobSubstitution::apply(Kernel::TermList,int)const::__1,Kernel::OnlyMemorizeNonVar<Kernel::TermList>&,Kernel::AutoDerefTermSpec::Context>::apply(Kernel::AutoDerefTermSpec_const&)::_lambda()_1_>
                ((OnlyMemorizeNonVar<Kernel::TermList> *)
                 CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                 (AutoDerefTermSpec *)in_stack_fffffffffffffe50,init);
      Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x95bdeb);
      in_stack_fffffffffffffddc =
           BottomUpChildIter<Kernel::AutoDerefTermSpec>::nChildren
                     (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
      Stack<Kernel::TermList>::pop
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffdc0.subs,
                 (uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      in_stack_fffffffffffffdd0 =
           Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
           operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)0x95be3e);
      Stack<Kernel::TermList>::push(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
    }
  }
  pSVar5 = Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
           operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)0x95be7d);
  local_8 = (uint64_t)Stack<Kernel::TermList>::pop(pSVar5);
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
            (in_stack_fffffffffffffdf0);
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)in_stack_fffffffffffffdf0);
  return (TermList)local_8;
}

Assistant:

Result apply(Arg const& toEval) 
  {
    /* recursion state. Contains a stack of items that are being recursed on. */
    Recycled<Stack<BottomUpChildIter<Arg>>> recState;
    Recycled<Stack<Result>> recResults;

    recState->push(BottomUpChildIter<Arg>(toEval, _context));

    while (!recState->isEmpty()) {
      if (recState->top().hasNext(_context)) {
        Arg t = recState->top().next(_context);

        Option<Result> nonRec = _evNonRec(t);
        if (nonRec) {
          recResults->push(move_if_value<Result>(*nonRec));

        } else {
          Option<Result> cached = _memo.get(t);
          if (cached.isSome()) {
            recResults->push(std::move(cached).unwrap());
          } else {
            recState->push(BottomUpChildIter<Arg>(t, _context));
          }

        }

      } else {

        BottomUpChildIter<Arg> orig = recState->pop();

        ASS_GE(recResults.size(), orig.nChildren(_context))
        Result* argLst = orig.nChildren(_context) == 0 
          ? nullptr 
          : static_cast<Result*>(&((*recResults)[recResults->size() - orig.nChildren(_context)]));

        Result eval = _memo.getOrInit(orig.self(), 
                        [&](){ return _function(orig.self(), argLst); });

        DEBUG_BOTTOM_UP(0, "evaluated: ", orig.self(), " -> ", eval);
        recResults->pop(orig.nChildren(_context));
        recResults->push(std::move(eval));
      }
    }
    ASS(recState->isEmpty())


    ASS(recResults->size() == 1);
    auto result = recResults->pop();
    DEBUG_BOTTOM_UP(0, "eval result: ", toEval, " -> ", result);
    return result;
  }